

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1.c
# Opt level: O3

uchar * SHA1(uchar *d,size_t n,uchar *md)

{
  uchar *extraout_RAX;
  ulong uVar1;
  SHA1_CTX local_88;
  
  local_88.state[0] = 0x67452301;
  local_88.state[1] = 0xefcdab89;
  local_88.state[2] = 0x98badcfe;
  local_88.state[3] = 0x10325476;
  local_88.state[4] = 0xc3d2e1f0;
  local_88.count[0] = 0;
  local_88.count[1] = 0;
  if ((int)md != 0) {
    uVar1 = (ulong)md & 0xffffffff;
    do {
      SHA1Update(&local_88,(uchar *)n,1);
      n = n + 1;
      uVar1 = uVar1 - 1;
    } while (uVar1 != 0);
  }
  SHA1Final(d,&local_88);
  return extraout_RAX;
}

Assistant:

void SHA1(
    char *hash_out,
    const char *str,
    uint32_t len)
{
    SHA1_CTX ctx;
    unsigned int ii;

    SHA1Init(&ctx);
    for (ii=0; ii<len; ii+=1)
        SHA1Update(&ctx, (const unsigned char*)str + ii, 1);
    SHA1Final((unsigned char *)hash_out, &ctx);
}